

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-mmap.cpp
# Opt level: O2

void __thiscall llama_file::impl::read_raw(impl *this,void *ptr,size_t len)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  char *pcVar4;
  runtime_error *prVar5;
  string sStack_48;
  
  if (len != 0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    sVar3 = fread(ptr,len,1,(FILE *)this->fp);
    iVar1 = ferror((FILE *)this->fp);
    if (iVar1 != 0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      pcVar4 = strerror(*piVar2);
      format_abi_cxx11_(&sStack_48,"read error: %s",pcVar4);
      std::runtime_error::runtime_error(prVar5,(string *)&sStack_48);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (sVar3 != 1) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"unexpectedly reached end of file");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void read_raw(void * ptr, size_t len) const {
        if (len == 0) {
            return;
        }
        errno = 0;
        std::size_t ret = std::fread(ptr, len, 1, fp);
        if (ferror(fp)) {
            throw std::runtime_error(format("read error: %s", strerror(errno)));
        }
        if (ret != 1) {
            throw std::runtime_error("unexpectedly reached end of file");
        }
    }